

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O1

void __thiscall QLineEdit::mouseDoubleClickEvent(QLineEdit *this,QMouseEvent *e)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  QLineEditPrivate *this_00;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  double dVar13;
  double dVar14;
  double extraout_XMM0_Qa;
  undefined1 auVar15 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar16 [16];
  QArrayData *local_50;
  int local_40;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  if (*(int *)(e + 0x40) == 1) {
    dVar13 = (double)QEventPoint::position();
    dVar13 = (double)((ulong)dVar13 & 0x8000000000000000 | (ulong)DAT_0066f5c0) + dVar13;
    dVar14 = 2147483647.0;
    if (dVar13 <= 2147483647.0) {
      dVar14 = dVar13;
    }
    if (dVar14 <= -2147483648.0) {
      dVar14 = -2147483648.0;
    }
    iVar6 = QLineEditPrivate::xToPos(this_00,(int)dVar14,CursorBetweenCharacters);
    bVar5 = QWidgetLineControl::composeMode((QWidgetLineControl *)this_00->control);
    iVar8 = iVar6;
    if (bVar5) {
      iVar1 = this_00->control->m_cursor;
      QTextLayout::preeditAreaText();
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,2,0x10);
        }
      }
      iVar2 = (int)(this_00->control->m_text).d.size;
      QWidgetLineControl::commitPreedit((QWidgetLineControl *)this_00->control);
      iVar3 = (int)(this_00->control->m_text).d.size;
      iVar7 = iVar3 - iVar2;
      if (local_40 < iVar6 - iVar1 || iVar6 - iVar1 < 0) {
        if (iVar1 < iVar6) {
          iVar8 = (iVar6 - local_40) + iVar7;
        }
      }
      else {
        iVar8 = -1;
        if (iVar3 != iVar2) {
          iVar8 = iVar7 + iVar1;
          if (iVar6 <= iVar8) {
            iVar8 = iVar6;
          }
          if (iVar8 < iVar1) {
            iVar8 = iVar1;
          }
        }
      }
    }
    if (-1 < iVar8) {
      QWidgetLineControl::selectWordAtPos((QWidgetLineControl *)this_00->control,iVar8);
    }
    iVar8 = QApplication::doubleClickInterval();
    QBasicTimer::start(&this_00->tripleClickTimer,(long)iVar8 * 1000000,1,this);
    uVar9 = QEventPoint::position();
    auVar16._0_8_ =
         (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa;
    auVar16._8_8_ =
         (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM0_Qa;
    auVar16 = minpd(_DAT_0066f5d0,auVar16);
    auVar15._8_8_ = -(ulong)(-2147483648.0 < auVar16._8_8_);
    auVar15._0_8_ = -(ulong)(-2147483648.0 < auVar16._0_8_);
    uVar10 = movmskpd(uVar9,auVar15);
    uVar12 = 0x8000000000000000;
    if ((uVar10 & 1) != 0) {
      uVar12 = (ulong)(uint)(int)auVar16._0_8_ << 0x20;
    }
    uVar11 = 0x80000000;
    if ((uVar10 & 2) != 0) {
      uVar11 = (ulong)(uint)(int)auVar16._8_8_;
    }
    this_00->tripleClick = (QPoint)(uVar11 | uVar12);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    QLineEditPrivate::sendMouseEventToInputContext(this_00,e);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::mouseDoubleClickEvent(QMouseEvent* e)
{
    Q_D(QLineEdit);

    if (e->button() == Qt::LeftButton) {
        int position = d->xToPos(e->position().toPoint().x());

        // exit composition mode
#ifndef QT_NO_IM
        if (d->control->composeMode()) {
            int preeditPos = d->control->cursor();
            int posInPreedit = position - d->control->cursor();
            int preeditLength = d->control->preeditAreaText().size();
            bool positionOnPreedit = false;

            if (posInPreedit >= 0 && posInPreedit <= preeditLength)
                positionOnPreedit = true;

            int textLength = d->control->end();
            d->control->commitPreedit();
            int sizeChange = d->control->end() - textLength;

            if (positionOnPreedit) {
                if (sizeChange == 0)
                    position = -1; // cancel selection, word disappeared
                else
                    // ensure not selecting after preedit if event happened there
                    position = qBound(preeditPos, position, preeditPos + sizeChange);
            } else if (position > preeditPos) {
                // adjust positions after former preedit by how much text changed
                position += (sizeChange - preeditLength);
            }
        }
#endif

        if (position >= 0)
            d->control->selectWordAtPos(position);

        d->tripleClickTimer.start(QApplication::doubleClickInterval(), this);
        d->tripleClick = e->position().toPoint();
    } else {
        d->sendMouseEventToInputContext(e);
    }
}